

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall Database::addPost(Database *this,int userId,string *content)

{
  int iVar1;
  ostream *poVar2;
  DatabaseException *this_00;
  char *errorMsg;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  errorMsg = (char *)0x0;
  std::__cxx11::to_string(&local_40,userId);
  std::operator+(&local_a0,"insert into posts (user_id, content) values (",&local_40);
  std::operator+(&local_c0,&local_a0,",\'");
  std::operator+(&error,&local_c0,content);
  std::operator+(&query,&error,"\');");
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = sqlite3_exec(this->database,query._M_dataplus._M_p,(sqlite3_callback)0x0,(void *)0x0,
                       &errorMsg);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Post added successfully");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&query);
    return;
  }
  std::__cxx11::string::string((string *)&error,errorMsg,(allocator *)&local_c0);
  sqlite3_free(errorMsg);
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_60,"Error while adding post: ",&error);
  DatabaseException::DatabaseException(this_00,&local_60);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

void Database::addPost(int userId, std::string content)
{
	char* errorMsg = nullptr;
	std::string query = "insert into posts (user_id, content) values (" +
						std::to_string(userId) + ",'" + content + "');";

	int failure = sqlite3_exec(database, query.c_str(), nullptr, nullptr, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while adding post: " + error);
	}
	else
	{
		std::cout << "Post added successfully" << std::endl;
	}
}